

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signed-interest.c
# Opt level: O1

int ndn_signed_interest_ecdsa_verify(ndn_interest_t *interest,ndn_ecc_pub_t *pub_key)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t input_size;
  int iVar4;
  uint uVar5;
  uint8_t uVar7;
  void *pvVar6;
  int iVar8;
  name_component_t *component;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  uint8_t local_2f8 [8];
  uint8_t be_signed [680];
  ndn_encoder_t local_40;
  
  if (-1 < (char)interest->flags) {
    return -0x11;
  }
  if ((interest->name).components[(ulong)(interest->name).components_size - 1].type != 2) {
    return -0x11;
  }
  memset(local_2f8,0,0x2a8);
  pvVar6 = memset(local_2f8,0,0x2a8);
  iVar4 = (int)pvVar6;
  local_40.output_max_size = 0x2a8;
  local_40.offset = 0;
  bVar11 = 1 < (interest->name).components_size;
  local_40.output_value = local_2f8;
  if ((bVar11) &&
     (iVar4 = name_component_tlv_encode(&local_40,(name_component_t *)interest), iVar4 == 0)) {
    component = (interest->name).components;
    iVar9 = 0;
    do {
      component = component + 1;
      iVar8 = (interest->name).components_size - 1;
      iVar9 = iVar9 + 1;
      bVar11 = iVar9 < iVar8;
      if (iVar8 <= iVar9) break;
      iVar4 = name_component_tlv_encode(&local_40,component);
    } while (iVar4 == 0);
  }
  uVar3 = local_40.offset;
  if (bVar11) {
    return iVar4;
  }
  uVar10 = (ulong)local_40.offset;
  if ((interest->flags & 0x40) == 0) goto LAB_00110ffe;
  if (local_40.output_max_size == local_40.offset) {
    return -0xe;
  }
  local_40.output_value[uVar10] = '$';
  uVar5 = local_40.offset + 1;
  uVar2 = (interest->parameters).size;
  if (uVar2 < 0xfd && local_40.output_max_size != uVar5) {
    iVar4 = 1;
    local_40.offset = uVar5;
LAB_00111160:
    local_40.output_value[local_40.offset] = (uint8_t)uVar2;
    iVar9 = 0;
    bVar11 = true;
    local_40.offset = uVar5 + iVar4;
  }
  else {
    uVar7 = (uint8_t)(uVar2 >> 8);
    if (2 < local_40.output_max_size - uVar5 && uVar2 < 0x10000) {
      local_40.output_value[uVar5] = 0xfd;
      local_40.output_value[local_40.offset + 2] = uVar7;
      local_40.offset = local_40.offset + 3;
      iVar4 = 3;
      goto LAB_00111160;
    }
    if (4 < local_40.output_max_size - uVar5) {
      local_40.output_value[uVar5] = 0xfe;
      local_40.output_value[local_40.offset + 2] = (uint8_t)(uVar2 >> 0x18);
      local_40.output_value[local_40.offset + 3] = (uint8_t)(uVar2 >> 0x10);
      local_40.output_value[local_40.offset + 4] = uVar7;
      local_40.offset = local_40.offset + 5;
      iVar4 = 5;
      goto LAB_00111160;
    }
    iVar9 = -0xe;
    bVar11 = false;
    local_40.offset = uVar5;
  }
  if (!bVar11) {
    return iVar9;
  }
  uVar5 = (interest->parameters).size;
  if ((int)(local_40.output_max_size - local_40.offset) < (int)uVar5) {
    return -10;
  }
  memcpy(local_40.output_value + local_40.offset,&interest->parameters,(ulong)uVar5);
  local_40.offset = local_40.offset + uVar5;
LAB_00110ffe:
  uVar5 = ndn_signature_info_tlv_encode(&local_40,&interest->signature);
  input_size = local_40.offset;
  if (((uVar5 == 0) &&
      (uVar5 = ndn_signature_value_tlv_encode(&local_40,&interest->signature), uVar5 == 0)) &&
     (uVar5 = ndn_ecdsa_verify(local_40.output_value,input_size,(interest->signature).sig_value,
                               (interest->signature).sig_size,pub_key), -1 < (int)uVar5)) {
    bVar1 = (interest->name).components_size;
    iVar4 = ndn_sha256_verify(local_40.output_value + uVar10,local_40.offset - uVar3,
                              (interest->name).components[(ulong)bVar1 - 1].value,
                              (uint)(interest->name).components[(ulong)bVar1 - 1].size);
    uVar5 = iVar4 >> 0x1f & 0xffffffe2;
  }
  return uVar5;
}

Assistant:

int
ndn_signed_interest_ecdsa_verify(const ndn_interest_t* interest, const ndn_ecc_pub_t* pub_key)
{
  // check the signed Interest format
  if (!ndn_interest_is_signed(interest) ||
      interest->name.components[interest->name.components_size - 1].type != TLV_ParametersSha256DigestComponent) {
    return NDN_UNSUPPORTED_FORMAT;
  }
  int ret_val = -1;
  uint8_t be_signed[NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE] = {0};
  ndn_encoder_t temp_encoder;
  encoder_init(&temp_encoder, be_signed, NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE);

  // the signing input starts at Name's Value (V) excluding the ending component
  for (uint8_t i = 0; i < interest->name.components_size - 1; i++) {
    ret_val = name_component_tlv_encode(&temp_encoder, &interest->name.components[i]);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  // the digest input starts at parameters
  uint32_t param_block_starting = temp_encoder.offset;
  if (ndn_interest_has_Parameters(interest)) {
    ret_val = encoder_append_type(&temp_encoder, TLV_ApplicationParameters);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(&temp_encoder, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(&temp_encoder, interest->parameters.value, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  ret_val = ndn_signature_info_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;
  // the signing input ends at signature info
  uint32_t siginfo_block_ending = temp_encoder.offset;
  ret_val = ndn_signature_value_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;

  int result = ndn_ecdsa_verify(temp_encoder.output_value, siginfo_block_ending,
                                interest->signature.sig_value, interest->signature.sig_size,
                                pub_key);
  if (result < 0) return result;

  result = ndn_sha256_verify(&temp_encoder.output_value[param_block_starting],
                             temp_encoder.offset - param_block_starting,
                             interest->name.components[interest->name.components_size - 1].value,
                             interest->name.components[interest->name.components_size - 1].size);
  if (result < 0)
    return NDN_SEC_SIGNED_INTEREST_INVALID_DIGEST;
  return NDN_SUCCESS;
}